

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureR32F(DrawTestBase *this,texture *texture)

{
  GLuint i;
  long lVar1;
  GLfloat data [32];
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    data[lVar1] = -1.0;
  }
  Utils::texture::create(texture,0x10,2,0x822e);
  Utils::texture::update(texture,0x10,2,0,0x1903,0x1406,data);
  return;
}

Assistant:

void DrawTestBase::prepareTextureR32F(Utils::texture& texture)
{
	static const GLuint size = m_r32f_width * m_r32f_height;
	GLfloat				data[size];

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1.0f;
	}

	texture.create(m_r32f_width, m_r32f_height, GL_R32F);
	texture.update(m_r32f_width, m_r32f_height, 0 /* depth */, GL_RED, GL_FLOAT, data);
}